

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::relaxedNmaddF16x8
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *__return_storage_ptr___00;
  Literal *this_00;
  long lVar1;
  undefined1 local_360 [8];
  LaneArray<8> x;
  LaneArray<8> y;
  LaneArray<8> z;
  LaneArray<8> r;
  Literal local_48;
  
  getLanesF16x8((LaneArray<8> *)local_360,this);
  getLanesF16x8((LaneArray<8> *)&x._M_elems[7].type,left);
  getLanesF16x8((LaneArray<8> *)&y._M_elems[7].type,right);
  lVar1 = 0;
  memset(&z._M_elems[7].type,0,0xc0);
  __return_storage_ptr___00 = &r._M_elems[7].type;
  do {
    nmadd(&local_48,(Literal *)(local_360 + lVar1),(Literal *)((long)y._M_elems + lVar1 + -8),
          (Literal *)((long)z._M_elems + lVar1 + -8));
    convertF32ToF16((Literal *)__return_storage_ptr___00,&local_48);
    this_00 = (Literal *)((long)r._M_elems + lVar1 + -8);
    if (this_00 != (Literal *)__return_storage_ptr___00) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)&z._M_elems[7].type);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)r._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)z._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)((long)y._M_elems + lVar1 + -8));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_360 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedNmaddF16x8(const Literal& left,
                                   const Literal& right) const {
  return ternary<8, &Literal::getLanesF16x8, &Literal::nmadd, &toFP16>(
    *this, left, right);
}